

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceVkImpl::AllocateTransientCmdPool
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,CommandPoolWrapper *CmdPool,
          VulkanCommandBuffer *CmdBuffer,Char *DebugPoolName)

{
  bool bVar1;
  uint Value;
  VkPipelineStageFlags StageMask;
  VkAccessFlags AccessMask;
  ICommandQueueVk *pIVar2;
  pointer ppVar3;
  element_type *peVar4;
  VkCommandBuffer VkCmdBuffer;
  Char *pCVar5;
  char (*Args_2) [2];
  undefined1 local_128 [8];
  string msg_2;
  undefined1 local_100 [4];
  VkResult err;
  VkCommandBufferBeginInfo CmdBuffBeginInfo;
  string msg_1;
  VkCommandBuffer vkCmdBuff;
  VkCommandBufferAllocateInfo BuffAllocInfo;
  Uint32 local_6c;
  undefined1 local_68 [8];
  string msg;
  _Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
  local_40;
  iterator CmdPoolMgrIter;
  HardwareQueueIndex QueueFamilyIndex;
  Char *DebugPoolName_local;
  VulkanCommandBuffer *CmdBuffer_local;
  CommandPoolWrapper *CmdPool_local;
  RenderDeviceVkImpl *this_local;
  SoftwareQueueIndex CommandQueueId_local;
  
  Args_2 = (char (*) [2])DebugPoolName;
  CmdPoolMgrIter.
  super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
  ._M_cur._6_1_ = CommandQueueId.m_Value;
  pIVar2 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&this->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CommandQueueId);
  Value = (*(pIVar2->super_ICommandQueue).super_IObject._vptr_IObject[0xc])();
  IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>
            ((IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)
             ((long)&CmdPoolMgrIter.
                     super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                     ._M_cur + 7),Value);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
       ::find(&this->m_TransientCmdPoolMgrs,
              (key_type *)
              ((long)&CmdPoolMgrIter.
                      super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                      ._M_cur + 7));
  msg.field_2._8_8_ =
       std::
       unordered_map<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>_>
       ::end(&this->m_TransientCmdPoolMgrs);
  bVar1 = std::__detail::operator!=
                    (&local_40,
                     (_Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                      *)((long)&msg.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_6c = IndexWrapper::operator_cast_to_unsigned_int
                         ((IndexWrapper *)
                          ((long)&CmdPoolMgrIter.
                                  super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                                  ._M_cur + 7));
    FormatString<char[69],unsigned_int,char[2]>
              ((string *)local_68,
               (Diligent *)"Con not find transient command pool manager for queue family index (",
               (char (*) [69])&local_6c,(uint *)0xcabce5,Args_2);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"AllocateTransientCmdPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x102);
    std::__cxx11::string::~string((string *)local_68);
  }
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false,_false>
                         *)&local_40);
  CommandPoolManager::AllocateCommandPool
            ((CommandPoolWrapper *)&BuffAllocInfo.level,&ppVar3->second,DebugPoolName);
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  operator=(CmdPool,(VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>
                     *)&BuffAllocInfo.level);
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *)
             &BuffAllocInfo.level);
  memset(&vkCmdBuff,0,0x20);
  vkCmdBuff._0_4_ = 0x28;
  BuffAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  BuffAllocInfo._4_4_ = 0;
  BuffAllocInfo.pNext =
       VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkCommandPool_T_
                 ((VulkanObjectWrapper *)CmdPool);
  BuffAllocInfo.commandPool._0_4_ = 0;
  BuffAllocInfo.commandPool._4_4_ = 1;
  peVar4 = std::
           __shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_LogicalVkDevice);
  VkCmdBuffer = VulkanUtilities::VulkanLogicalDevice::AllocateVkCommandBuffer
                          (peVar4,(VkCommandBufferAllocateInfo *)&vkCmdBuff,"");
  if (VkCmdBuffer == (VkCommandBuffer)0x0) {
    FormatString<char[41]>
              ((string *)&CmdBuffBeginInfo.pInheritanceInfo,
               (char (*) [41])"Failed to allocate Vulkan command buffer");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"AllocateTransientCmdPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x10f);
    std::__cxx11::string::~string((string *)&CmdBuffBeginInfo.pInheritanceInfo);
  }
  memset(local_100,0,0x20);
  local_100 = (undefined1  [4])0x2a;
  CmdBuffBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  CmdBuffBeginInfo._4_4_ = 0;
  CmdBuffBeginInfo.pNext._0_4_ = 1;
  CmdBuffBeginInfo.flags = 0;
  CmdBuffBeginInfo._20_4_ = 0;
  msg_2.field_2._12_4_ = (*vkBeginCommandBuffer)(VkCmdBuffer,(VkCommandBufferBeginInfo *)local_100);
  if (msg_2.field_2._12_4_ != VK_SUCCESS) {
    FormatString<char[30]>((string *)local_128,(char (*) [30])"vkBeginCommandBuffer() failed");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"AllocateTransientCmdPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x11b);
    std::__cxx11::string::~string((string *)local_128);
  }
  peVar4 = std::
           __shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_LogicalVkDevice);
  StageMask = VulkanUtilities::VulkanLogicalDevice::GetSupportedStagesMask
                        (peVar4,CmdPoolMgrIter.
                                super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                                ._M_cur._7_1_);
  peVar4 = std::
           __shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_LogicalVkDevice);
  AccessMask = VulkanUtilities::VulkanLogicalDevice::GetSupportedAccessMask
                         (peVar4,CmdPoolMgrIter.
                                 super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                                 ._M_cur._7_1_);
  VulkanUtilities::VulkanCommandBuffer::SetVkCmdBuffer(CmdBuffer,VkCmdBuffer,StageMask,AccessMask);
  return;
}

Assistant:

void RenderDeviceVkImpl::AllocateTransientCmdPool(SoftwareQueueIndex                    CommandQueueId,
                                                  VulkanUtilities::CommandPoolWrapper&  CmdPool,
                                                  VulkanUtilities::VulkanCommandBuffer& CmdBuffer,
                                                  const Char*                           DebugPoolName)
{
    HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    auto               CmdPoolMgrIter = m_TransientCmdPoolMgrs.find(QueueFamilyIndex);
    VERIFY(CmdPoolMgrIter != m_TransientCmdPoolMgrs.end(),
           "Con not find transient command pool manager for queue family index (", Uint32{QueueFamilyIndex}, ")");

    CmdPool = CmdPoolMgrIter->second.AllocateCommandPool(DebugPoolName);

    // Allocate command buffer from the cmd pool
    VkCommandBufferAllocateInfo BuffAllocInfo{};
    BuffAllocInfo.sType              = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    BuffAllocInfo.pNext              = nullptr;
    BuffAllocInfo.commandPool        = CmdPool;
    BuffAllocInfo.level              = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    BuffAllocInfo.commandBufferCount = 1;

    VkCommandBuffer vkCmdBuff = m_LogicalVkDevice->AllocateVkCommandBuffer(BuffAllocInfo);
    DEV_CHECK_ERR(vkCmdBuff != VK_NULL_HANDLE, "Failed to allocate Vulkan command buffer");


    VkCommandBufferBeginInfo CmdBuffBeginInfo{};
    CmdBuffBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    CmdBuffBeginInfo.pNext = nullptr;
    CmdBuffBeginInfo.flags = VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT; // Each recording of the command buffer will only be
                                                                          // submitted once, and the command buffer will be reset
                                                                          // and recorded again between each submission.
    CmdBuffBeginInfo.pInheritanceInfo = nullptr;                          // Ignored for a primary command buffer

    VkResult err = vkBeginCommandBuffer(vkCmdBuff, &CmdBuffBeginInfo);
    DEV_CHECK_ERR(err == VK_SUCCESS, "vkBeginCommandBuffer() failed");
    (void)err;

    CmdBuffer.SetVkCmdBuffer(vkCmdBuff,
                             m_LogicalVkDevice->GetSupportedStagesMask(QueueFamilyIndex),
                             m_LogicalVkDevice->GetSupportedAccessMask(QueueFamilyIndex));
}